

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoProvider.cpp
# Opt level: O0

void InfoProvider::initGPUInfo(void)

{
  QStringView v;
  bool bVar1;
  const_iterator pvVar2;
  QString *this;
  char *pcVar3;
  Worker *this_00;
  QByteArray local_210;
  QString local_1f8;
  QChar local_1da;
  qsizetype local_1d8;
  qsizetype qStack_1d0;
  qsizetype local_1c8;
  storage_type_conflict *local_1c0;
  qsizetype qStack_1b8;
  QStringView optName;
  const_iterator __end1;
  const_iterator __begin1;
  array<Option,_12UL> *__range1;
  QString availableOptions;
  undefined1 local_168 [4];
  int index;
  array<Option,_12UL> options;
  QString local_38;
  undefined1 local_20 [8];
  QString queryHelp;
  
  QString::QString(&local_38,"nvidia-smi --help-query-gpu");
  Utils::exec((QString *)local_20,&local_38);
  QString::~QString(&local_38);
  memcpy(local_168,&DAT_00142330,0x120);
  availableOptions.d.size._4_4_ = 0;
  QString::QString((QString *)&__range1);
  __end1 = std::array<Option,_12UL>::begin((array<Option,_12UL> *)local_168);
  pvVar2 = std::array<Option,_12UL>::end((array<Option,_12UL> *)local_168);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    local_1c8 = (__end1->name).m_size;
    local_1c0 = (__end1->name).m_data;
    optName.m_data = (storage_type_conflict *)__end1->index;
    qStack_1b8 = local_1c8;
    optName.m_size = (qsizetype)local_1c0;
    bVar1 = QString::contains((QString *)local_20,__end1->name,CaseSensitive);
    if (bVar1) {
      *(int *)optName.m_data = availableOptions.d.size._4_4_;
      local_1d8 = qStack_1b8;
      qStack_1d0 = optName.m_size;
      v.m_data = (storage_type_conflict *)optName.m_size;
      v.m_size = qStack_1b8;
      QString::append((QString *)&__range1,v);
      QChar::QChar(&local_1da,',');
      QString::append((QChar *)&__range1);
      availableOptions.d.size._4_4_ = availableOptions.d.size._4_4_ + 1;
    }
  }
  this = QtPrivate::asString((QString *)&__range1);
  QString::toLocal8Bit(&local_210,this);
  pcVar3 = QByteArray::constData(&local_210);
  QString::asprintf((char *)&local_1f8,"nvidia-smi --query-gpu=%s --format=csv,noheader,nounits",
                    pcVar3);
  QString::operator=(&m_infoQueryCmd,&local_1f8);
  QString::~QString(&local_1f8);
  QByteArray::~QByteArray(&local_210);
  updateData();
  this_00 = (Worker *)operator_new(0x18);
  *(undefined8 *)&this_00->super_Worker = 0;
  *(undefined8 *)&(this_00->super_Worker).field_0x8 = 0;
  (this_00->super_Worker).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  Worker::Worker(this_00);
  m_worker = this_00;
  QString::~QString((QString *)&__range1);
  QString::~QString((QString *)local_20);
  return;
}

Assistant:

void InfoProvider::initGPUInfo() {
    const auto queryHelp = exec_cmd("nvidia-smi --help-query-gpu");

    struct Option {
        QStringView name;
        int &index;
    };

    constexpr std::array options{
        Option{u"temperature.gpu"_qsv, m_iGpuTemp},
        Option{u"temperature.memory"_qsv, m_iMemTemp},
        Option{u"clocks.gr"_qsv, m_iGpuFreq},
        Option{u"clocks.max.gr"_qsv, m_iGpuFreqMax},
        Option{u"clocks.mem"_qsv, m_iMemFreq},
        Option{u"clocks.max.mem"_qsv, m_iMemFreqMax},
        Option{u"power.draw"_qsv, m_iPower},
        Option{u"utilization.gpu"_qsv, m_iGpuUtil},
        Option{u"utilization.memory"_qsv, m_iMemUtil},
        Option{u"memory.total"_qsv, m_iMemTotal},
        Option{u"memory.free"_qsv, m_iMemFree},
        Option{u"memory.used"_qsv, m_iMemUsed}
    };

    int index{0};
    QString availableOptions;

    for (const auto [optName, optIndex] : options) {
        if (queryHelp.contains(optName)) {
            optIndex = index;
            availableOptions.append(optName);
            availableOptions.append(',');
            ++index;
        }
    }

    m_infoQueryCmd = QString::asprintf(
        "nvidia-smi --query-gpu=%s --format=csv,noheader,nounits", qPrintable(availableOptions));

    updateData();
    m_worker = new Worker();
}